

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

void Abc_TtExpand(word *pTruth0,int nVars,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  word wVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  word *pwVar12;
  uint uVar13;
  word *pwVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  word *pwVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  word *pwVar23;
  long lVar24;
  word *pwVar25;
  word *pLimit;
  
  uVar20 = (ulong)(nCutSize0 - 1);
  if (0 < nCutSize0 && 0 < nCutSize) {
    iVar10 = nVars + -6;
    uVar21 = 1 << ((byte)iVar10 & 0x1f);
    uVar11 = (ulong)uVar21;
    if ((int)uVar21 < 2) {
      uVar11 = 1;
    }
    uVar19 = (ulong)(uint)nCutSize;
    do {
      uVar1 = uVar19 - 1;
      iVar6 = (int)uVar20;
      if (pCut[uVar19 - 1] <= pCut0[uVar20]) {
        if (pCut[uVar19 - 1] != pCut0[uVar20]) {
          __assert_fail("pCut[i] == pCut0[k]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                        ,0x597,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
        }
        if ((long)iVar6 < (long)uVar1) {
          if ((long)nVars < (long)uVar19) {
            __assert_fail("iVar < jVar && jVar < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                          ,0x512,"void Abc_TtSwapVars(word *, int, int, int)");
          }
          bVar8 = (byte)uVar20;
          if (nVars < 7) {
            uVar16 = *pTruth0;
            bVar8 = (char)(-1 << (bVar8 & 0x1f)) + (char)(1 << ((byte)uVar1 & 0x1f));
            *pTruth0 = (uVar16 & *(ulong *)(uVar20 * 0x90 + 0x8e2320 + uVar1 * 0x18)) >>
                       (bVar8 & 0x3f) |
                       (*(ulong *)(uVar20 * 0x90 + 0x8e2318 + uVar1 * 0x18) & uVar16) <<
                       (bVar8 & 0x3f) | s_PPMasks[uVar20 - 1][uVar19 + 5][0] & uVar16;
          }
          else if ((long)uVar19 < 7) {
            if (iVar10 != 0x1f) {
              bVar8 = (char)(1 << ((byte)uVar1 & 0x1f)) + (char)(-1 << (bVar8 & 0x1f));
              uVar16 = s_PPMasks[uVar20 - 1][uVar19 + 5][0];
              uVar2 = *(ulong *)(uVar20 * 0x90 + 0x8e2318 + uVar1 * 0x18);
              uVar20 = *(ulong *)(uVar20 * 0x90 + 0x8e2320 + uVar1 * 0x18);
              uVar17 = 0;
              do {
                uVar3 = pTruth0[uVar17];
                pTruth0[uVar17] =
                     (uVar3 & uVar20) >> (bVar8 & 0x3f) |
                     (uVar3 & uVar2) << (bVar8 & 0x3f) | uVar3 & uVar16;
                uVar17 = uVar17 + 1;
              } while (uVar11 != uVar17);
            }
          }
          else if (iVar6 < 6) {
            if (iVar10 != 0x1f) {
              bVar9 = (byte)(uVar19 - 7);
              uVar13 = 1 << (bVar9 & 0x1f);
              iVar7 = 2 << (bVar9 & 0x1f);
              uVar16 = 1;
              if (1 < (int)uVar13) {
                uVar16 = (ulong)uVar13;
              }
              pwVar12 = pTruth0 + (int)uVar13;
              pwVar18 = pTruth0;
              do {
                if (uVar19 - 7 != 0x1f) {
                  uVar2 = s_Truths6[uVar20];
                  uVar17 = 0;
                  do {
                    uVar3 = pwVar18[uVar17];
                    bVar9 = (byte)(1 << (bVar8 & 0x1f));
                    uVar4 = pwVar12[uVar17];
                    pwVar18[uVar17] = uVar3 & ~uVar2 | uVar4 << (bVar9 & 0x3f) & uVar2;
                    pwVar12[uVar17] = uVar4 & uVar2 | (uVar3 & uVar2) >> (bVar9 & 0x3f);
                    uVar17 = uVar17 + 1;
                  } while (uVar16 != uVar17);
                }
                pwVar18 = pwVar18 + iVar7;
                pwVar12 = pwVar12 + iVar7;
              } while (pwVar18 < pTruth0 + (int)uVar21);
            }
          }
          else if (iVar10 != 0x1f) {
            bVar8 = (byte)(uVar19 - 7);
            bVar9 = (byte)(iVar6 + -6);
            uVar13 = 1 << (bVar9 & 0x1f);
            iVar7 = 2 << (bVar8 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar13) {
              uVar20 = (ulong)uVar13;
            }
            lVar15 = (long)(2 << (bVar9 & 0x1f));
            lVar22 = (long)(1 << (bVar8 & 0x1f));
            pwVar12 = pTruth0 + lVar22;
            pwVar18 = pTruth0 + (int)uVar13;
            pwVar23 = pTruth0;
            do {
              if (uVar19 - 7 != 0x1f) {
                lVar24 = 0;
                pwVar14 = pwVar18;
                pwVar25 = pwVar12;
                do {
                  if (iVar6 + -6 != 0x1f) {
                    uVar16 = 0;
                    do {
                      wVar5 = pwVar14[uVar16];
                      pwVar14[uVar16] = pwVar25[uVar16];
                      pwVar25[uVar16] = wVar5;
                      uVar16 = uVar16 + 1;
                    } while (uVar20 != uVar16);
                  }
                  lVar24 = lVar24 + lVar15;
                  pwVar25 = pwVar25 + lVar15;
                  pwVar14 = pwVar14 + lVar15;
                } while (lVar24 < lVar22);
              }
              pwVar23 = pwVar23 + iVar7;
              pwVar12 = pwVar12 + iVar7;
              pwVar18 = pwVar18 + iVar7;
            } while (pwVar23 < pTruth0 + (int)uVar21);
          }
        }
        uVar20 = (ulong)(iVar6 - 1);
      }
    } while ((1 < (long)uVar19) && (uVar19 = uVar1, -1 < (int)uVar20));
  }
  if ((int)uVar20 != -1) {
    __assert_fail("k == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x59c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
  }
  return;
}

Assistant:

static inline void Abc_TtExpand( word * pTruth0, int nVars, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            Abc_TtSwapVars( pTruth0, nVars, k, i );
        k--;
    }
    assert( k == -1 );
}